

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O3

void __thiscall comparer_context::EOFActual(comparer_context *this)

{
  undefined8 *puVar1;
  size_t sVar2;
  stringstream ss;
  string local_1e8;
  char *local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x1010);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Unexpected EOF reading ACTUAL.\nCurrent position in scene hierarchy is ",
             0x46);
  print_hierarchy_abi_cxx11_(&local_1e8,this);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__cxx11::stringbuf::str();
  *puVar1 = &PTR__compare_fails_exception_0080b7e0;
  strncpy((char *)(puVar1 + 1),local_1c8,0xfff);
  sVar2 = strlen((char *)(puVar1 + 1));
  *(undefined2 *)((long)puVar1 + sVar2 + 8) = 10;
  __cxa_throw(puVar1,&compare_fails_exception::typeinfo,
              compare_fails_exception::~compare_fails_exception);
}

Assistant:

void EOFActual() {
        std::stringstream ss;
        throw compare_fails_exception((ss
            << "Unexpected EOF reading ACTUAL.\nCurrent position in scene hierarchy is "
            << print_hierarchy(),ss.str().c_str()
            ));
    }